

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O1

Error asmjit::v1_14::Formatter::formatNode
                (String *sb,FormatOptions *formatOptions,BaseBuilder *builder,BaseNode *node)

{
  uint uVar1;
  CodeHolder *pCVar2;
  Error EVar3;
  Error EVar4;
  uint uVar5;
  size_t n;
  char *pcVar6;
  Error unaff_EBX;
  ulong uVar7;
  Operand_ *op;
  FormatFlags FVar8;
  FormatOptions *pFVar9;
  ulong uVar10;
  ConstPoolNode *constPoolNode;
  bool bVar11;
  bool bVar12;
  
  pFVar9 = formatOptions;
  if ((*(int *)(node + 0x14) != 0) && ((formatOptions->_flags & kPositions) != kNone)) {
    pFVar9 = (FormatOptions *)0x1;
    unaff_EBX = String::_opFormat(sb,kAppend,"<%05u> ");
    if (unaff_EBX != 0) {
      return unaff_EBX;
    }
  }
  uVar7 = (ulong)(byte)*sb;
  if (0x1e < uVar7) {
    uVar7 = *(ulong *)(sb + 8);
  }
  switch(node[0x10]) {
  case (BaseNode)0x1:
  case (BaseNode)0xf:
  case (BaseNode)0x12:
    EVar3 = (*(builder->super_BaseEmitter)._funcs.formatInstruction)
                      (sb,formatOptions->_flags,&builder->super_BaseEmitter,
                       (builder->super_BaseEmitter)._environment._arch,(BaseInst *)(node + 0x30),
                       (Operand_ *)(node + 0x40),SUB18(node[0x12],0));
    break;
  case (BaseNode)0x2:
    pCVar2 = (builder->super_BaseEmitter)._code;
    bVar11 = true;
    if (*(uint *)(node + 0x30) < *(uint *)&pCVar2->field_0xe0) {
      EVar3 = String::_opFormat(sb,kAppend,".section %s",
                                *(long *)(*(long *)&pCVar2->_sections +
                                         (ulong)*(uint *)(node + 0x30) * 8) + 0x20);
      bVar11 = EVar3 == 0;
      if (!bVar11) {
        unaff_EBX = EVar3;
      }
    }
    goto joined_r0x0011f4de;
  case (BaseNode)0x3:
    EVar3 = formatLabel(sb,(FormatFlags)pFVar9,&builder->super_BaseEmitter,
                        *(uint32_t *)(node + 0x30));
    if (EVar3 != 0) goto LAB_0011f21d;
    pcVar6 = ":";
LAB_0011f4f0:
    EVar3 = String::_opString(sb,kAppend,pcVar6,0xffffffffffffffff);
LAB_0011f504:
    bVar11 = EVar3 == 0;
    if (!bVar11) {
      unaff_EBX = EVar3;
    }
    goto joined_r0x0011f4de;
  case (BaseNode)0x4:
    pcVar6 = "data";
    if (node[0x12] == (BaseNode)0x0) {
      pcVar6 = "code";
    }
    EVar3 = String::_opFormat(sb,kAppend,".align %u (%s)",(ulong)*(uint *)(node + 0x30),pcVar6);
    break;
  case (BaseNode)0x5:
    FVar8 = kMachineCode;
    EVar3 = String::_opChar(sb,kAppend,'.');
    if ((EVar3 == 0) &&
       (EVar3 = formatDataType(sb,FVar8,(builder->super_BaseEmitter)._environment._arch,
                               (TypeId)node[0x12]), EVar3 == 0)) {
      EVar3 = String::_opFormat(sb,kAppend," {Count=%zu Repeat=%zu TotalSize=%zu}",
                                *(long *)(node + 0x30),*(undefined8 *)(node + 0x38),
                                (ulong)(byte)node[0x13] * *(long *)(node + 0x30));
      goto LAB_0011f504;
    }
    goto LAB_0011f21d;
  case (BaseNode)0x6:
    FVar8 = kMachineCode;
    EVar3 = String::_opString(sb,kAppend,".label ",0xffffffffffffffff);
    if (EVar3 == 0) {
      EVar3 = formatLabel(sb,FVar8,&builder->super_BaseEmitter,*(uint32_t *)(node + 0x30));
      goto LAB_0011f504;
    }
    goto LAB_0011f21d;
  case (BaseNode)0x7:
    FVar8 = kMachineCode;
    EVar3 = String::_opString(sb,kAppend,".label (",0xffffffffffffffff);
    if ((EVar3 == 0) &&
       (EVar3 = formatLabel(sb,FVar8,&builder->super_BaseEmitter,*(uint32_t *)(node + 0x30)),
       EVar3 == 0)) {
      FVar8 = kMachineCode;
      EVar3 = String::_opString(sb,kAppend," - ",0xffffffffffffffff);
      if ((EVar3 == 0) &&
         (EVar3 = formatLabel(sb,FVar8,&builder->super_BaseEmitter,*(uint32_t *)(node + 0x34)),
         EVar3 == 0)) {
        pcVar6 = ")";
        goto LAB_0011f4f0;
      }
    }
LAB_0011f21d:
    bVar11 = false;
    unaff_EBX = EVar3;
    goto joined_r0x0011f4de;
  case (BaseNode)0x8:
    EVar3 = String::_opFormat(sb,kAppend,"[ConstPool Size=%zu Alignment=%zu]",
                              *(undefined8 *)(node + 0x128),*(undefined8 *)(node + 0x130));
    break;
  case (BaseNode)0x9:
    EVar3 = String::_opFormat(sb,kAppend,"; %s",*(undefined8 *)(node + 0x28));
    return EVar3;
  case (BaseNode)0xa:
    pcVar6 = "[Sentinel]";
    if (node[0x12] == (BaseNode)0x1) {
      pcVar6 = "[FuncEnd]";
    }
    EVar3 = String::_opString(sb,kAppend,pcVar6,0xffffffffffffffff);
    break;
  default:
    EVar3 = String::_opFormat(sb,kAppend,"[UserNode:%u]",(ulong)(byte)node[0x10]);
    break;
  case (BaseNode)0x10:
    bVar11 = true;
    if ((builder->super_BaseEmitter)._emitterType == kCompiler) {
      EVar3 = formatLabel(sb,(FormatFlags)pFVar9,&builder->super_BaseEmitter,
                          *(uint32_t *)(node + 0x30));
      if ((((EVar3 == 0) &&
           (EVar3 = String::_opString(sb,kAppend,": ",0xffffffffffffffff), EVar3 == 0)) &&
          (EVar3 = formatFuncValuePack(sb,formatOptions->_flags,(BaseCompiler *)builder,
                                       (FuncValuePack *)(node + 0xc0),(RegOnly *)0x0), EVar3 == 0))
         && ((EVar3 = String::_opString(sb,kAppend," Func(",0xffffffffffffffff), EVar3 == 0 &&
             (EVar3 = formatFuncArgs(sb,formatOptions->_flags,(BaseCompiler *)builder,
                                     (FuncDetail *)(node + 0x34),*(ArgPack **)(node + 0x348)),
             EVar3 == 0)))) {
        EVar3 = String::_opString(sb,kAppend,")",0xffffffffffffffff);
        bVar11 = EVar3 == 0;
        if (!bVar11) {
          unaff_EBX = EVar3;
        }
      }
      else {
        bVar11 = false;
        unaff_EBX = EVar3;
      }
    }
    goto joined_r0x0011f4de;
  case (BaseNode)0x11:
    EVar3 = String::_opString(sb,kAppend,"[FuncRet]",0xffffffffffffffff);
    if (EVar3 == 0) {
      op = (Operand_ *)(node + 0x40);
      uVar10 = 0;
      bVar11 = false;
      do {
        if ((byte)node[0x13] <= uVar10) {
          formatNode();
        }
        if ((op->_signature)._bits == 0) {
          bVar12 = true;
        }
        else {
          pcVar6 = ", ";
          if (uVar10 == 0) {
            pcVar6 = " ";
          }
          EVar3 = String::_opString(sb,kAppend,pcVar6,0xffffffffffffffff);
          if (EVar3 == 0) {
            EVar3 = formatOperand(sb,formatOptions->_flags,&builder->super_BaseEmitter,
                                  (builder->super_BaseEmitter)._environment._arch,op);
            bVar12 = EVar3 == 0;
            if (!bVar12) {
              unaff_EBX = EVar3;
            }
          }
          else {
            bVar12 = false;
            unaff_EBX = EVar3;
          }
        }
        if (!bVar12) break;
        uVar10 = uVar10 + 1;
        op = op + 1;
        bVar11 = uVar10 != 1;
      } while (uVar10 == 1);
    }
    else {
      bVar11 = false;
      unaff_EBX = EVar3;
    }
joined_r0x0011f4de:
    if (!bVar11) {
      return unaff_EBX;
    }
    goto LAB_0011f384;
  }
  if (EVar3 == 0) {
LAB_0011f384:
    if (*(long *)(node + 0x28) != 0) {
      uVar1 = *(uint *)(formatOptions->_padding)._data;
      uVar5 = 0x2c;
      if ((short)uVar1 != 0) {
        uVar5 = uVar1;
      }
      uVar10 = (ulong)(byte)*sb;
      if (0x1e < uVar10) {
        uVar10 = *(ulong *)(sb + 8);
      }
      n = (ulong)(uVar5 & 0xffff) - (uVar10 - uVar7);
      if ((((ulong)(uVar5 & 0xffff) < uVar10 - uVar7 || n == 0) ||
          (EVar3 = String::_opChars(sb,kAppend,' ',n), EVar3 == 0)) &&
         (EVar3 = String::_opString(sb,kAppend,"; ",0xffffffffffffffff), EVar3 == 0)) {
        EVar4 = String::_opString(sb,kAppend,*(char **)(node + 0x28),0xffffffffffffffff);
        bVar11 = EVar4 == 0;
        EVar3 = unaff_EBX;
        if (!bVar11) {
          EVar3 = EVar4;
        }
      }
      else {
        bVar11 = false;
      }
      if (!bVar11) {
        return EVar3;
      }
    }
    EVar3 = 0;
  }
  return EVar3;
}

Assistant:

Error formatNode(
  String& sb,
  const FormatOptions& formatOptions,
  const BaseBuilder* builder,
  const BaseNode* node) noexcept {

  if (node->hasPosition() && formatOptions.hasFlag(FormatFlags::kPositions))
    ASMJIT_PROPAGATE(sb.appendFormat("<%05u> ", node->position()));

  size_t startLineIndex = sb.size();

  switch (node->type()) {
    case NodeType::kInst:
    case NodeType::kJump: {
      const InstNode* instNode = node->as<InstNode>();
      ASMJIT_PROPAGATE(builder->_funcs.formatInstruction(sb, formatOptions.flags(), builder,
        builder->arch(),
        instNode->baseInst(), instNode->operands(), instNode->opCount()));
      break;
    }

    case NodeType::kSection: {
      const SectionNode* sectionNode = node->as<SectionNode>();
      if (builder->_code->isSectionValid(sectionNode->id())) {
        const Section* section = builder->_code->sectionById(sectionNode->id());
        ASMJIT_PROPAGATE(sb.appendFormat(".section %s", section->name()));
      }
      break;
    }

    case NodeType::kLabel: {
      const LabelNode* labelNode = node->as<LabelNode>();
      ASMJIT_PROPAGATE(formatLabel(sb, formatOptions.flags(), builder, labelNode->labelId()));
      ASMJIT_PROPAGATE(sb.append(":"));
      break;
    }

    case NodeType::kAlign: {
      const AlignNode* alignNode = node->as<AlignNode>();
      ASMJIT_PROPAGATE(sb.appendFormat(".align %u (%s)",
        alignNode->alignment(),
        alignNode->alignMode() == AlignMode::kCode ? "code" : "data"));
      break;
    }

    case NodeType::kEmbedData: {
      const EmbedDataNode* embedNode = node->as<EmbedDataNode>();
      ASMJIT_PROPAGATE(sb.append('.'));
      ASMJIT_PROPAGATE(formatDataType(sb, formatOptions.flags(), builder->arch(), embedNode->typeId()));
      ASMJIT_PROPAGATE(sb.appendFormat(" {Count=%zu Repeat=%zu TotalSize=%zu}", embedNode->itemCount(), embedNode->repeatCount(), embedNode->dataSize()));
      break;
    }

    case NodeType::kEmbedLabel: {
      const EmbedLabelNode* embedNode = node->as<EmbedLabelNode>();
      ASMJIT_PROPAGATE(sb.append(".label "));
      ASMJIT_PROPAGATE(formatLabel(sb, formatOptions.flags(), builder, embedNode->labelId()));
      break;
    }

    case NodeType::kEmbedLabelDelta: {
      const EmbedLabelDeltaNode* embedNode = node->as<EmbedLabelDeltaNode>();
      ASMJIT_PROPAGATE(sb.append(".label ("));
      ASMJIT_PROPAGATE(formatLabel(sb, formatOptions.flags(), builder, embedNode->labelId()));
      ASMJIT_PROPAGATE(sb.append(" - "));
      ASMJIT_PROPAGATE(formatLabel(sb, formatOptions.flags(), builder, embedNode->baseLabelId()));
      ASMJIT_PROPAGATE(sb.append(")"));
      break;
    }

    case NodeType::kConstPool: {
      const ConstPoolNode* constPoolNode = node->as<ConstPoolNode>();
      ASMJIT_PROPAGATE(sb.appendFormat("[ConstPool Size=%zu Alignment=%zu]", constPoolNode->size(), constPoolNode->alignment()));
      break;
    };

    case NodeType::kComment: {
      const CommentNode* commentNode = node->as<CommentNode>();
      return sb.appendFormat("; %s", commentNode->inlineComment());
    }

    case NodeType::kSentinel: {
      const SentinelNode* sentinelNode = node->as<SentinelNode>();
      const char* sentinelName = nullptr;

      switch (sentinelNode->sentinelType()) {
        case SentinelType::kFuncEnd:
          sentinelName = "[FuncEnd]";
          break;

        default:
          sentinelName = "[Sentinel]";
          break;
      }

      ASMJIT_PROPAGATE(sb.append(sentinelName));
      break;
    }

#ifndef ASMJIT_NO_COMPILER
    case NodeType::kFunc: {
      const FuncNode* funcNode = node->as<FuncNode>();

      if (builder->isCompiler()) {
        ASMJIT_PROPAGATE(formatLabel(sb, formatOptions.flags(), builder, funcNode->labelId()));
        ASMJIT_PROPAGATE(sb.append(": "));

        ASMJIT_PROPAGATE(formatFuncRets(sb, formatOptions.flags(), static_cast<const BaseCompiler*>(builder), funcNode->detail()));
        ASMJIT_PROPAGATE(sb.append(" Func("));
        ASMJIT_PROPAGATE(formatFuncArgs(sb, formatOptions.flags(), static_cast<const BaseCompiler*>(builder), funcNode->detail(), funcNode->argPacks()));
        ASMJIT_PROPAGATE(sb.append(")"));
      }
      break;
    }

    case NodeType::kFuncRet: {
      const FuncRetNode* retNode = node->as<FuncRetNode>();
      ASMJIT_PROPAGATE(sb.append("[FuncRet]"));

      for (uint32_t i = 0; i < 2; i++) {
        const Operand_& op = retNode->op(i);
        if (!op.isNone()) {
          ASMJIT_PROPAGATE(sb.append(i == 0 ? " " : ", "));
          ASMJIT_PROPAGATE(formatOperand(sb, formatOptions.flags(), builder, builder->arch(), op));
        }
      }
      break;
    }

    case NodeType::kInvoke: {
      const InvokeNode* invokeNode = node->as<InvokeNode>();
      ASMJIT_PROPAGATE(builder->_funcs.formatInstruction(sb, formatOptions.flags(), builder,
        builder->arch(),
        invokeNode->baseInst(), invokeNode->operands(), invokeNode->opCount()));
      break;
    }
#endif

    default: {
      ASMJIT_PROPAGATE(sb.appendFormat("[UserNode:%u]", node->type()));
      break;
    }
  }

  if (node->hasInlineComment()) {
    size_t requiredPadding = paddingFromOptions(formatOptions, FormatPaddingGroup::kRegularLine);
    size_t currentPadding = sb.size() - startLineIndex;

    if (currentPadding < requiredPadding)
      ASMJIT_PROPAGATE(sb.appendChars(' ', requiredPadding - currentPadding));

    ASMJIT_PROPAGATE(sb.append("; "));
    ASMJIT_PROPAGATE(sb.append(node->inlineComment()));
  }

  return kErrorOk;
}